

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MT.h
# Opt level: O0

int GetLatestMTMessageMT(MT *pMT,int addr,int mid,uchar *databuf,int databuflen,int *pNbdatabytes)

{
  int iVar1;
  double dVar2;
  undefined1 local_18a0 [8];
  CHRONO chrono;
  uchar *puStack_1850;
  int len;
  uchar *ptr;
  int local_1840;
  int recvbuflen;
  int Bytes;
  int BytesReceived;
  uchar savebuf [2048];
  uchar recvbuf [4096];
  int *pNbdatabytes_local;
  int databuflen_local;
  uchar *databuf_local;
  int mid_local;
  int addr_local;
  MT *pMT_local;
  
  recvbuflen = 0;
  local_1840 = 0;
  ptr._4_4_ = 0;
  puStack_1850 = (uchar *)0x0;
  chrono._68_4_ = 0;
  StartChrono((CHRONO *)local_18a0);
  memset(savebuf + 0x7f8,0,0x1000);
  memset(&Bytes,0,0x800);
  ptr._4_4_ = 0x7ff;
  recvbuflen = 0;
  iVar1 = ReadRS232Port(&pMT->RS232Port,savebuf + 0x7f8,0x7ff,&local_1840);
  if (iVar1 == 0) {
    recvbuflen = local_1840 + recvbuflen;
    if (ptr._4_4_ <= recvbuflen) {
      while (local_1840 == ptr._4_4_) {
        dVar2 = GetTimeElapsedChronoQuick((CHRONO *)local_18a0);
        if (4.0 < dVar2) {
          printf("Error reading data from a MT : Message timeout. \n");
          return 2;
        }
        memcpy(&Bytes,savebuf + 0x7f8,(long)local_1840);
        iVar1 = ReadRS232Port(&pMT->RS232Port,savebuf + 0x7f8,ptr._4_4_,&local_1840);
        if (iVar1 != 0) {
          printf("Error reading data from a MT. \n");
          return 1;
        }
        recvbuflen = local_1840 + recvbuflen;
      }
      memmove(savebuf + ((long)ptr._4_4_ - (long)local_1840) + 0x7f8,savebuf + 0x7f8,
              (long)local_1840);
      memcpy(savebuf + 0x7f8,(void *)((long)&Bytes + (long)local_1840),
             (long)(ptr._4_4_ - local_1840));
      recvbuflen = ptr._4_4_;
    }
    while (iVar1 = FindLatestMTMessage(savebuf + 0x7f8,recvbuflen,addr,mid,&stack0xffffffffffffe7b0,
                                       (int *)&chrono.field_0x44), iVar1 != 0) {
      dVar2 = GetTimeElapsedChronoQuick((CHRONO *)local_18a0);
      if (4.0 < dVar2) {
        printf("Error reading data from a MT : Message timeout. \n");
        return 2;
      }
      if (0xffe < recvbuflen) {
        printf("Error reading data from a MT : Invalid data. \n");
        return 4;
      }
      iVar1 = ReadRS232Port(&pMT->RS232Port,savebuf + (long)recvbuflen + 0x7f8,0xfff - recvbuflen,
                            &local_1840);
      if (iVar1 != 0) {
        printf("Error reading data from a MT. \n");
        return 1;
      }
      recvbuflen = local_1840 + recvbuflen;
    }
    memset(databuf,0,(long)databuflen);
    puStack_1850 = GetDataBytesMTMessage(puStack_1850,pNbdatabytes);
    if (databuflen < *pNbdatabytes) {
      printf("Too small data buffer.\n");
      pMT_local._4_4_ = 1;
    }
    else {
      if (0 < *pNbdatabytes) {
        memcpy(databuf,puStack_1850,(long)*pNbdatabytes);
      }
      pMT_local._4_4_ = 0;
    }
  }
  else {
    printf("Error reading data from a MT. \n");
    pMT_local._4_4_ = 1;
  }
  return pMT_local._4_4_;
}

Assistant:

inline int GetLatestMTMessageMT(MT* pMT, int addr, int mid, unsigned char* databuf, int databuflen, int* pNbdatabytes)
{
	unsigned char recvbuf[2*MAX_NB_BYTES_MT];
	unsigned char savebuf[MAX_NB_BYTES_MT];
	int BytesReceived = 0, Bytes = 0, recvbuflen = 0;
	unsigned char* ptr = NULL;
	int len = 0;
	CHRONO chrono;

	StartChrono(&chrono);

	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	memset(savebuf, 0, sizeof(savebuf));
	recvbuflen = MAX_NB_BYTES_MT-1; // The last character must be a 0 to be a valid string for sscanf.
	BytesReceived = 0;

	if (ReadRS232Port(&pMT->RS232Port, (unsigned char*)recvbuf, recvbuflen, &Bytes) != EXIT_SUCCESS)
	{
		printf("Error reading data from a MT. \n");
		return EXIT_FAILURE;
	}
	BytesReceived += Bytes;

	if (BytesReceived >= recvbuflen)
	{
		// If the buffer is full and if the device always sends data, there might be old data to discard...

		while (Bytes == recvbuflen)
		{
			if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_MT)
			{
				printf("Error reading data from a MT : Message timeout. \n");
				return EXIT_TIMEOUT;
			}
			memcpy(savebuf, recvbuf, Bytes);
			if (ReadRS232Port(&pMT->RS232Port, (unsigned char*)recvbuf, recvbuflen, &Bytes) != EXIT_SUCCESS)
			{
				printf("Error reading data from a MT. \n");
				return EXIT_FAILURE;
			}
			BytesReceived += Bytes;
		}

		// The desired message should be among all the data gathered, unless there was 
		// so many other messages sent after that the desired message was in the 
		// discarded data, or we did not wait enough...

		memmove(recvbuf+recvbuflen-Bytes, recvbuf, Bytes);
		memcpy(recvbuf, savebuf+Bytes, recvbuflen-Bytes);

		// Only the last recvbuflen bytes received should be taken into account in what follows.
		BytesReceived = recvbuflen;
	}

	// The data need to be analyzed and we must check if we need to get more data from 
	// the device to get the desired message.
	// But normally we should not have to get more data unless we did not wait enough
	// for the desired message...

	while (FindLatestMTMessage(recvbuf, BytesReceived, addr, mid, &ptr, &len) != EXIT_SUCCESS)
	{
		if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_MT)
		{
			printf("Error reading data from a MT : Message timeout. \n");
			return EXIT_TIMEOUT;
		}
		// The last character must be a 0 to be a valid string for sscanf.
		if (BytesReceived >= 2*MAX_NB_BYTES_MT-1)
		{
			printf("Error reading data from a MT : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
		if (ReadRS232Port(&pMT->RS232Port, (unsigned char*)recvbuf+BytesReceived, 2*MAX_NB_BYTES_MT-1-BytesReceived, &Bytes) != EXIT_SUCCESS)
		{
			printf("Error reading data from a MT. \n");
			return EXIT_FAILURE;
		}
		BytesReceived += Bytes;
	}

	// Get data bytes.

	memset(databuf, 0, databuflen);
	ptr = GetDataBytesMTMessage(ptr, pNbdatabytes);
	// Check the number of data bytes before copy.
	if (databuflen < *pNbdatabytes)
	{
		printf("Too small data buffer.\n");
		return EXIT_FAILURE;
	}
	// Copy the data bytes of the message.
	if (*pNbdatabytes > 0)
	{
		memcpy(databuf, ptr, *pNbdatabytes);
	}

	return EXIT_SUCCESS;
}